

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImg<float> * __thiscall cimg_library::CImg<float>::move_to(CImg<float> *this,CImg<float> *img)

{
  if ((this->_is_shared == false) && (img->_is_shared != true)) {
    swap(this,img);
  }
  else {
    assign<float>(img,this);
  }
  assign(this);
  return img;
}

Assistant:

CImg<T>& move_to(CImg<T>& img) {
      if (_is_shared || img._is_shared) img.assign(*this);
      else swap(img);
      assign();
      return img;
    }